

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_charRefNumber(ENCODING *UNUSED_enc,char *ptr)

{
  byte *pbVar1;
  char *pcVar2;
  uint result;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((ptr[4] == '\0') && (ptr[5] == 'x')) {
    pbVar1 = (byte *)(ptr + 7);
    result = 0;
    do {
      if (pbVar1[-1] == 0) {
        iVar3 = (int)(char)*pbVar1;
        if (iVar3 == 0x3b) goto LAB_00316a6f;
        uVar4 = *pbVar1 - 0x30;
        uVar5 = (ulong)uVar4;
        if (uVar4 < 0x37) {
          if ((0x3ffUL >> (uVar5 & 0x3f) & 1) == 0) {
            if ((0x7e0000UL >> (uVar5 & 0x3f) & 1) == 0) {
              if ((0x7e000000000000U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_00316a38;
              result = (result * 0x10 + iVar3) - 0x57;
            }
            else {
              result = (result * 0x10 + iVar3) - 0x37;
            }
          }
          else {
            result = result << 4 | iVar3 - 0x30U;
          }
          if (0x10ffff < (int)result) {
            return -1;
          }
        }
      }
LAB_00316a38:
      pbVar1 = pbVar1 + 2;
    } while( true );
  }
  pcVar2 = ptr + 5;
  result = 0;
  do {
    iVar3 = -0x31;
    if (pcVar2[-1] == '\0') {
      if (*pcVar2 == 0x3b) {
LAB_00316a6f:
        iVar3 = checkCharRefNumber(result);
        return iVar3;
      }
      iVar3 = *pcVar2 + -0x30;
    }
    result = result * 10 + iVar3;
    pcVar2 = pcVar2 + 2;
    if (0x10ffff < (int)result) {
      return -1;
    }
  } while( true );
}

Assistant:

PREFIX(charRefNumber)(const ENCODING *UNUSED_P(enc), const char *ptr)
{
  int result = 0;
  /* skip &# */
  ptr += 2*MINBPC(enc);
  if (CHAR_MATCHES(enc, ptr, ASCII_x)) {
    for (ptr += MINBPC(enc);
         !CHAR_MATCHES(enc, ptr, ASCII_SEMI);
         ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      switch (c) {
      case ASCII_0: case ASCII_1: case ASCII_2: case ASCII_3: case ASCII_4:
      case ASCII_5: case ASCII_6: case ASCII_7: case ASCII_8: case ASCII_9:
        result <<= 4;
        result |= (c - ASCII_0);
        break;
      case ASCII_A: case ASCII_B: case ASCII_C:
      case ASCII_D: case ASCII_E: case ASCII_F:
        result <<= 4;
        result += 10 + (c - ASCII_A);
        break;
      case ASCII_a: case ASCII_b: case ASCII_c:
      case ASCII_d: case ASCII_e: case ASCII_f:
        result <<= 4;
        result += 10 + (c - ASCII_a);
        break;
      }
      if (result >= 0x110000)
        return -1;
    }
  }
  else {
    for (; !CHAR_MATCHES(enc, ptr, ASCII_SEMI); ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      result *= 10;
      result += (c - ASCII_0);
      if (result >= 0x110000)
        return -1;
    }
  }
  return checkCharRefNumber(result);
}